

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1e8ba::CpuTest_dec_zerox_decrements_Test::TestBody
          (CpuTest_dec_zerox_decrements_Test *this)

{
  ushort uVar1;
  code *pcVar2;
  byte bVar3;
  bool bVar4;
  MockSpec<unsigned_char_(unsigned_short)> *pMVar5;
  TypedExpectation<unsigned_char_(unsigned_short)> *pTVar6;
  MockSpec<void_(unsigned_short,_unsigned_char)> *pMVar7;
  char *message;
  AssertHelper local_268;
  Message local_260;
  undefined1 local_258 [8];
  AssertionResult gtest_ar;
  Matcher<unsigned_char> local_240;
  Matcher<unsigned_short> local_228;
  MockSpec<void_(unsigned_short,_unsigned_char)> local_210;
  WithoutMatchers local_1d1;
  Matcher<unsigned_char> local_1d0;
  Matcher<unsigned_short> local_1b8;
  MockSpec<void_(unsigned_short,_unsigned_char)> local_1a0;
  ReturnAction<int> local_168;
  Action<unsigned_char_(unsigned_short)> local_158;
  WithoutMatchers local_131;
  Matcher<unsigned_short> local_130;
  MockSpec<unsigned_char_(unsigned_short)> local_118;
  ReturnAction<int> local_f8;
  Action<unsigned_char_(unsigned_short)> local_e8;
  WithoutMatchers local_c1;
  Matcher<unsigned_short> local_c0;
  MockSpec<unsigned_char_(unsigned_short)> local_a8;
  ReturnAction<int> local_88;
  Action<unsigned_char_(unsigned_short)> local_78;
  WithoutMatchers local_55 [13];
  Matcher<unsigned_short> local_48;
  MockSpec<unsigned_char_(unsigned_short)> local_30;
  CpuTest_dec_zerox_decrements_Test *local_10;
  CpuTest_dec_zerox_decrements_Test *this_local;
  
  (this->super_CpuTest).expected.pc = 0x4321;
  (this->super_CpuTest).registers.pc = 0x4321;
  (this->super_CpuTest).expected.x = 0xed;
  (this->super_CpuTest).registers.x = 0xed;
  local_10 = this;
  n_e_s::core::test::CpuTest::stage_instruction(&this->super_CpuTest,0xd6);
  uVar1 = (this->super_CpuTest).expected.pc;
  if (!SCARRY4((uint)uVar1,1)) {
    (this->super_CpuTest).expected.pc = uVar1 + 1;
    testing::Matcher<unsigned_short>::Matcher(&local_48,0x4322);
    n_e_s::core::test::MockMmu::gmock_read_byte
              (&local_30,&(this->super_CpuTest).mmu.super_MockMmu,&local_48);
    testing::internal::GetWithoutMatchers();
    pMVar5 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::operator()
                       (&local_30,local_55,(void *)0x0);
    pTVar6 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
                       (pMVar5,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_cpu.cpp"
                        ,0x27c,"mmu","read_byte(0x4322)");
    testing::Return<int>((testing *)&local_88,0x44);
    testing::internal::ReturnAction::operator_cast_to_Action(&local_78,(ReturnAction *)&local_88);
    testing::internal::TypedExpectation<unsigned_char_(unsigned_short)>::WillOnce(pTVar6,&local_78);
    testing::Action<unsigned_char_(unsigned_short)>::~Action(&local_78);
    testing::internal::ReturnAction<int>::~ReturnAction(&local_88);
    testing::internal::MockSpec<unsigned_char_(unsigned_short)>::~MockSpec(&local_30);
    testing::Matcher<unsigned_short>::~Matcher(&local_48);
    testing::Matcher<unsigned_short>::Matcher(&local_c0,0x44);
    n_e_s::core::test::MockMmu::gmock_read_byte
              (&local_a8,&(this->super_CpuTest).mmu.super_MockMmu,&local_c0);
    testing::internal::GetWithoutMatchers();
    pMVar5 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::operator()
                       (&local_a8,&local_c1,(void *)0x0);
    pTVar6 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
                       (pMVar5,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_cpu.cpp"
                        ,0x27d,"mmu","read_byte(0x44)");
    testing::Return<int>((testing *)&local_f8,0xcd);
    testing::internal::ReturnAction::operator_cast_to_Action(&local_e8,(ReturnAction *)&local_f8);
    testing::internal::TypedExpectation<unsigned_char_(unsigned_short)>::WillOnce(pTVar6,&local_e8);
    testing::Action<unsigned_char_(unsigned_short)>::~Action(&local_e8);
    testing::internal::ReturnAction<int>::~ReturnAction(&local_f8);
    testing::internal::MockSpec<unsigned_char_(unsigned_short)>::~MockSpec(&local_a8);
    testing::Matcher<unsigned_short>::~Matcher(&local_c0);
    bVar3 = n_e_s::core::test::u16_to_u8(0x131);
    testing::Matcher<unsigned_short>::Matcher(&local_130,(ushort)bVar3);
    n_e_s::core::test::MockMmu::gmock_read_byte
              (&local_118,&(this->super_CpuTest).mmu.super_MockMmu,&local_130);
    testing::internal::GetWithoutMatchers();
    pMVar5 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::operator()
                       (&local_118,&local_131,(void *)0x0);
    pTVar6 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
                       (pMVar5,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_cpu.cpp"
                        ,0x27e,"mmu","read_byte(u16_to_u8(0x44 + 0xED))");
    testing::Return<int>((testing *)&local_168,5);
    testing::internal::ReturnAction::operator_cast_to_Action(&local_158,(ReturnAction *)&local_168);
    testing::internal::TypedExpectation<unsigned_char_(unsigned_short)>::WillOnce(pTVar6,&local_158)
    ;
    testing::Action<unsigned_char_(unsigned_short)>::~Action(&local_158);
    testing::internal::ReturnAction<int>::~ReturnAction(&local_168);
    testing::internal::MockSpec<unsigned_char_(unsigned_short)>::~MockSpec(&local_118);
    testing::Matcher<unsigned_short>::~Matcher(&local_130);
    bVar3 = n_e_s::core::test::u16_to_u8(0x131);
    testing::Matcher<unsigned_short>::Matcher(&local_1b8,(ushort)bVar3);
    testing::Matcher<unsigned_char>::Matcher(&local_1d0,'\x05');
    n_e_s::core::test::MockMmu::gmock_write_byte
              (&local_1a0,&(this->super_CpuTest).mmu.super_MockMmu,&local_1b8,&local_1d0);
    testing::internal::GetWithoutMatchers();
    pMVar7 = testing::internal::MockSpec<void_(unsigned_short,_unsigned_char)>::operator()
                       (&local_1a0,&local_1d1,(void *)0x0);
    testing::internal::MockSpec<void_(unsigned_short,_unsigned_char)>::InternalExpectedAt
              (pMVar7,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_cpu.cpp"
               ,0x27f,"mmu","write_byte(u16_to_u8(0x44 + 0xED), 0x05)");
    testing::internal::MockSpec<void_(unsigned_short,_unsigned_char)>::~MockSpec(&local_1a0);
    testing::Matcher<unsigned_char>::~Matcher(&local_1d0);
    testing::Matcher<unsigned_short>::~Matcher(&local_1b8);
    bVar3 = n_e_s::core::test::u16_to_u8(0x131);
    testing::Matcher<unsigned_short>::Matcher(&local_228,(ushort)bVar3);
    testing::Matcher<unsigned_char>::Matcher(&local_240,'\x04');
    n_e_s::core::test::MockMmu::gmock_write_byte
              (&local_210,&(this->super_CpuTest).mmu.super_MockMmu,&local_228,&local_240);
    testing::internal::GetWithoutMatchers();
    pMVar7 = testing::internal::MockSpec<void_(unsigned_short,_unsigned_char)>::operator()
                       (&local_210,
                        (WithoutMatchers *)
                        ((long)&gtest_ar.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        + 7),(void *)0x0);
    testing::internal::MockSpec<void_(unsigned_short,_unsigned_char)>::InternalExpectedAt
              (pMVar7,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_cpu.cpp"
               ,0x280,"mmu","write_byte(u16_to_u8(0x44 + 0xED), 0x04)");
    testing::internal::MockSpec<void_(unsigned_short,_unsigned_char)>::~MockSpec(&local_210);
    testing::Matcher<unsigned_char>::~Matcher(&local_240);
    testing::Matcher<unsigned_short>::~Matcher(&local_228);
    n_e_s::core::test::CpuTest::step_execution(&this->super_CpuTest,'\x06');
    testing::internal::EqHelper::
    Compare<n_e_s::core::CpuRegisters,_n_e_s::core::CpuRegisters,_nullptr>
              ((EqHelper *)local_258,"expected","registers",&(this->super_CpuTest).expected,
               &(this->super_CpuTest).registers);
    bVar4 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_258);
    if (!bVar4) {
      testing::Message::Message(&local_260);
      message = testing::AssertionResult::failure_message((AssertionResult *)local_258);
      testing::internal::AssertHelper::AssertHelper
                (&local_268,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_cpu.cpp"
                 ,0x283,message);
      testing::internal::AssertHelper::operator=(&local_268,&local_260);
      testing::internal::AssertHelper::~AssertHelper(&local_268);
      testing::Message::~Message(&local_260);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_258);
    return;
  }
  pcVar2 = (code *)invalidInstructionException();
  (*pcVar2)();
}

Assistant:

TEST_F(CpuTest, dec_zerox_decrements) {
    registers.pc = expected.pc = 0x4321;
    registers.x = expected.x = 0xED;

    stage_instruction(DEC_ZEROX);
    expected.pc += 1;

    EXPECT_CALL(mmu, read_byte(0x4322)).WillOnce(Return(0x44));
    EXPECT_CALL(mmu, read_byte(0x44)).WillOnce(Return(0xCD)); // Dummy read
    EXPECT_CALL(mmu, read_byte(u16_to_u8(0x44 + 0xED))).WillOnce(Return(0x05));
    EXPECT_CALL(mmu, write_byte(u16_to_u8(0x44 + 0xED), 0x05)); // Dummy write
    EXPECT_CALL(mmu, write_byte(u16_to_u8(0x44 + 0xED), 0x04));

    step_execution(6);
    EXPECT_EQ(expected, registers);
}